

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall
PDA::containsEndState
          (PDA *this,vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations)

{
  EvaluationState *pEVar1;
  EvaluationState *pEVar2;
  bool bVar3;
  EvaluationState *pEVar4;
  EvaluationState state;
  EvaluationState local_80;
  
  pEVar1 = (evaluations->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pEVar2 = (evaluations->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    pEVar4 = pEVar2;
    if (pEVar4 == pEVar1) break;
    EvaluationState::EvaluationState(&local_80,pEVar4);
    bVar3 = isEndState(this,local_80.currentStates);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_80);
    pEVar2 = pEVar4 + 1;
  } while (!bVar3);
  return pEVar4 != pEVar1;
}

Assistant:

bool PDA::containsEndState(std::vector<EvaluationState> evaluations) {
    for (EvaluationState state: evaluations) {
        if (isEndState(state.currentStates)) {
            return true;
        }
    }
    return false;
}